

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O3

int grisu3_print_double(double v,char *dst)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t ten_kappa;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint64_t d;
  long lVar11;
  char *buffer;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint64_t ulp;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint val;
  double dVar25;
  bool bVar26;
  double dVar27;
  undefined8 in_XMM0_Qb;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  grisu3_diy_fp_t gVar33;
  grisu3_diy_fp_t gVar34;
  
  auVar28._8_8_ = in_XMM0_Qb;
  auVar28._0_8_ = v;
  if (dst == (char *)0x0) {
    __assert_fail("dst",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                  ,0xd0,"int grisu3_print_double(double, char *)");
  }
  if (0xffe0000000000000 < (ulong)((long)v * 2)) {
    builtin_strncpy(dst,"NaN(",4);
    dst[0x14] = ')';
    dst[0x15] = '\0';
    lVar11 = 0x13;
    do {
      dst[lVar11] = grisu3_print_nan_hexdigits[SUB84(v,0) & 0xf];
      v = (double)((ulong)v >> 4);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 3);
    return 0x15;
  }
  buffer = dst;
  if ((long)v < 0) {
    *dst = '-';
    auVar28 = auVar28 ^ _DAT_00132ad0;
    v = ABS(v);
    buffer = dst + 1;
  }
  iVar6 = (int)buffer;
  iVar14 = (int)dst;
  if (v == INFINITY) {
    builtin_strncpy(buffer,"inf",4);
    return (iVar6 - iVar14) + 3;
  }
  if (v == 0.0) {
    buffer[0] = '0';
    buffer[1] = '\0';
    return (iVar6 - iVar14) + 1;
  }
  dVar25 = auVar28._0_8_;
  bVar26 = (auVar28 & (undefined1  [16])0x7ff0000000000000) == (undefined1  [16])0x0;
  uVar24 = ((ulong)dVar25 & 0xfffffffffffff) + 0x10000000000000;
  if (bVar26) {
    uVar24 = (ulong)dVar25 & 0xfffffffffffff;
  }
  iVar8 = -0x432;
  if (!bVar26) {
    iVar8 = ((auVar28._4_4_ & 0x7ff00000) >> 0x14) - 0x433;
  }
  gVar33.e = iVar8;
  gVar33.f = uVar24;
  gVar33._12_4_ = 0;
  gVar33 = grisu3_diy_fp_normalize(gVar33);
  iVar10 = gVar33.e;
  gVar34.e = iVar8 + -1;
  gVar34.f = uVar24 * 2 + 1;
  gVar34._12_4_ = 0;
  gVar34 = grisu3_diy_fp_normalize(gVar34);
  if ((dVar25 <= 0.0) || (1.79769313486232e+308 < dVar25)) {
    __assert_fail("v > 0 && v <= 1.7976931348623157e308",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                  ,0x8a,"int grisu3(double, char *, int *, int *)");
  }
  iVar7 = iVar8 + -2;
  lVar11 = uVar24 << 2;
  if ((auVar28 & (undefined1  [16])0xfffffffffffff) != (undefined1  [16])0x0 ||
      (auVar28 & (undefined1  [16])0x7ff0000000000000) == (undefined1  [16])0x0) {
    iVar7 = iVar8 + -1;
    lVar11 = uVar24 * 2;
  }
  uVar24 = lVar11 + -1 << ((char)iVar7 - (char)gVar34.e & 0x3fU);
  dVar27 = (double)(-0x3d - iVar10) * 0.30102999566398114;
  iVar7 = (int)dVar27 + (uint)(0.0 <= dVar27 && (double)(int)dVar27 != dVar27);
  iVar8 = iVar7 + 0x15b;
  iVar7 = iVar7 + 0x162;
  if (-1 < iVar8) {
    iVar7 = iVar8;
  }
  lVar11 = (long)(iVar7 >> 3);
  uVar12 = grisu3_diy_fp_pow_cache[lVar11 + 1].fract & 0xffffffff;
  uVar18 = grisu3_diy_fp_pow_cache[lVar11 + 1].fract >> 0x20;
  uVar16 = uVar24 >> 0x20;
  uVar24 = uVar24 & 0xffffffff;
  uVar20 = uVar18 * uVar24;
  uVar17 = uVar16 * uVar12;
  uVar21 = gVar34.f >> 0x20;
  uVar3 = uVar18 * (uint)gVar34.f;
  uVar22 = uVar21 * uVar12;
  uVar16 = (((uVar20 & 0xffffffff) + (uVar17 & 0xffffffff) + (uVar24 * uVar12 >> 0x20) + 0x80000000
            >> 0x20) + (uVar20 >> 0x20) + (uVar17 >> 0x20) + uVar18 * uVar16) - 1;
  uVar3 = ((uVar3 & 0xffffffff) + (uVar22 & 0xffffffff) + ((uint)gVar34.f * uVar12 >> 0x20) +
           0x80000000 >> 0x20) + (uVar3 >> 0x20) + (uVar22 >> 0x20) + uVar18 * uVar21 + 1;
  uVar24 = uVar3 - uVar16;
  if (uVar3 < uVar16) {
LAB_00124a7a:
    __assert_fail("x.e == y.e && x.f >= y.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_math.h"
                  ,0xf8,"grisu3_diy_fp_t grisu3_diy_fp_minus(grisu3_diy_fp_t, grisu3_diy_fp_t)");
  }
  uVar13 = (uint)grisu3_diy_fp_pow_cache[lVar11 + 1].d_exp;
  uVar17 = gVar33.f >> 0x20;
  uVar21 = gVar33.f & 0xffffffff;
  uVar22 = uVar18 * uVar21;
  uVar20 = uVar17 * uVar12;
  iVar8 = grisu3_diy_fp_pow_cache[lVar11 + 1].b_exp + iVar10;
  cVar1 = (char)iVar8;
  bVar4 = -cVar1 - 0x40;
  bVar5 = -cVar1;
  ten_kappa = 1L << (bVar5 & 0x3f);
  uVar16 = uVar3 >> (bVar5 & 0x3f);
  uVar18 = ((uVar22 & 0xffffffff) + (uVar20 & 0xffffffff) + (uVar12 * uVar21 >> 0x20) + 0x80000000
           >> 0x20) + (uVar22 >> 0x20) + (uVar20 >> 0x20) + uVar18 * uVar17;
  ulp = 1;
  uVar12 = ten_kappa - 1;
  uVar17 = uVar12 & uVar3;
  uVar19 = iVar8 * 0x4d1 + 0x26d51 >> 0xc;
  if (grisu3_pow10_cache[(long)(int)uVar19 + 1] <= (uint)uVar16) {
    uVar19 = uVar19 + 1;
  }
  uVar20 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    uVar16 = 0;
  }
  else {
    uVar21 = (ulong)grisu3_pow10_cache[uVar20];
    uVar22 = 0;
    do {
      uVar15 = uVar16 & 0xffffffff;
      uVar16 = uVar15 % uVar21;
      buffer[uVar22] = (char)(uVar15 / uVar21) + '0';
      uVar15 = (uVar16 << (bVar4 & 0x3f)) + uVar17;
      if (uVar15 < uVar24) {
        if ((gVar34.e != iVar10) || (uVar3 < uVar18)) goto LAB_00124a7a;
        uVar19 = ~(uint)uVar22 + uVar19;
        uVar23 = (uint)uVar22 + 1;
        uVar16 = (ulong)uVar23;
        iVar8 = grisu3_round_weed(buffer,uVar23,uVar3 - uVar18,uVar24,uVar15,
                                  uVar21 << (bVar4 & 0x3f),1);
        goto LAB_0012482a;
      }
      uVar22 = uVar22 + 1;
      uVar21 = uVar21 / 10;
    } while (uVar22 != uVar20);
    uVar16 = uVar20;
    uVar20 = 0;
  }
  do {
    ulp = ulp * 10;
    uVar24 = uVar24 * 10;
    buffer[uVar16] = (char)(uVar17 * 10 >> (bVar4 & 0x3f)) + '0';
    uVar16 = uVar16 + 1;
    uVar17 = uVar17 * 10 & uVar12;
    uVar19 = (int)uVar20 - 1;
    uVar20 = (ulong)uVar19;
  } while (uVar24 <= uVar17);
  if ((gVar34.e != iVar10) || (uVar3 < uVar18)) goto LAB_00124a7a;
  iVar8 = grisu3_round_weed(buffer,(int)uVar16,(uVar3 - uVar18) * ulp,uVar24,uVar17,ten_kappa,ulp);
  uVar16 = uVar16 & 0xffffffff;
LAB_0012482a:
  uVar23 = (uint)uVar16;
  if (iVar8 == 0) {
    iVar8 = sprintf(buffer,"%.17g",dVar25);
    return (iVar6 - iVar14) + iVar8;
  }
  val = uVar19 - uVar13;
  uVar9 = -val;
  uVar2 = 1;
  if (2 < (int)uVar23) {
    uVar2 = uVar23 - 1;
  }
  if (SBORROW4(uVar2,uVar9) == (int)(uVar2 + val) < 0) {
    uVar2 = uVar9;
  }
  if ((int)val < 0) {
    iVar8 = uVar23 + val;
    if ((-3 < iVar8) && (uVar23 == uVar9 || SBORROW4(uVar23,uVar9) != (int)(uVar23 + val) < 0)) {
      memmove(buffer + ((2 - (long)(int)val) - (long)(int)uVar23),buffer,(long)(int)uVar23);
      buffer[0] = '0';
      buffer[1] = '.';
      uVar24 = 2;
      if (iVar8 < 0) {
        memset(buffer + 2,0x30,(ulong)((~uVar19 + uVar13) - uVar23) + 1);
        uVar24 = 2;
        do {
          uVar24 = uVar24 + 1;
        } while (uVar24 < 2 - iVar8);
      }
      uVar23 = (int)uVar24 + uVar23;
      goto LAB_00124a39;
    }
    if (1 < (int)uVar23) {
      uVar24 = 1;
      if (1 < (int)uVar2) {
        uVar24 = (ulong)uVar2;
      }
      lVar11 = 0;
      do {
        buffer[lVar11 + uVar16] = buffer[lVar11 + (uVar16 - 1)];
        lVar11 = lVar11 + -1;
      } while (-lVar11 != uVar24);
      buffer[(int)(uVar23 - uVar2)] = '.';
      if (val + uVar2 == 0) {
        uVar23 = (uint)(uVar16 + 1);
      }
      else {
        buffer[uVar16 + 1] = 'e';
        iVar8 = grisu3_i_to_str(val + uVar2,buffer + uVar16 + 2);
        uVar23 = uVar23 + iVar8 + 2;
      }
      goto LAB_00124a39;
    }
  }
  else if (val < 3) {
    if (uVar19 != uVar13) {
      memset(buffer + (int)uVar23,0x30,(ulong)(uVar19 + ~uVar13) + 1);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = (long)(int)uVar23;
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      iVar8 = 2;
      do {
        uVar24 = auVar29._0_8_;
        uVar3 = auVar29._8_8_;
        auVar29._0_8_ = uVar24 + 1;
        auVar29._8_8_ = uVar3 - auVar32._8_8_;
        iVar10 = iVar8 + -2;
        iVar7 = iVar8 + (val + 1 & 6);
        iVar8 = iVar10;
      } while (iVar7 != 4);
      uVar19 = -iVar10;
      iVar8 = -(uint)((int)(val - 1 ^ 0x80000000) < (int)(uVar19 ^ 0x80000000));
      iVar10 = -(uint)((int)(val - 1 ^ 0x80000000) < (int)((uVar19 | 1) ^ 0x80000000));
      auVar30._0_8_ = CONCAT44(iVar8,iVar8);
      auVar30._8_4_ = iVar10;
      auVar30._12_4_ = iVar10;
      auVar31._0_8_ = uVar24 & auVar30._0_8_;
      auVar31._8_8_ = uVar3 & auVar30._8_8_;
      auVar31 = ~auVar30 & auVar29 | auVar31;
      uVar23 = auVar31._8_4_ + auVar31._0_4_;
    }
    goto LAB_00124a39;
  }
  buffer[(int)uVar23] = 'e';
  iVar8 = grisu3_i_to_str(val,buffer + (int)uVar23 + 1);
  uVar23 = uVar23 + iVar8 + 1;
LAB_00124a39:
  buffer[(int)uVar23] = '\0';
  return (iVar6 + uVar23) - iVar14;
}

Assistant:

static int grisu3_print_double(double v, char *dst)
{
    int d_exp, len, success, decimals, i;
    uint64_t u64 = grisu3_cast_uint64_from_double(v);
    char *s2 = dst;
    assert(dst);

    /* Prehandle NaNs */
    if ((u64 << 1) > 0xFFE0000000000000ULL) return grisu3_print_nan(u64, dst);
    /* Prehandle negative values. */
    if ((u64 & GRISU3_D64_SIGN) != 0) { *s2++ = '-'; v = -v; u64 ^= GRISU3_D64_SIGN; }
    /* Prehandle zero. */
    if (!u64) { *s2++ = '0'; *s2 = '\0'; return (int)(s2 - dst); }
    /* Prehandle infinity. */
    if (u64 == GRISU3_D64_EXP_MASK) { *s2++ = 'i'; *s2++ = 'n'; *s2++ = 'f'; *s2 = '\0'; return (int)(s2 - dst); }

    success = grisu3(v, s2, &len, &d_exp);
    /* If grisu3 was not able to convert the number to a string, then use old sprintf (suboptimal). */
    if (!success) return sprintf(s2, "%.17g", v) + (int)(s2 - dst);

    /* We now have an integer string of form "151324135" and a base-10 exponent for that number. */
    /* Next, decide the best presentation for that string by whether to use a decimal point, or the scientific exponent notation 'e'. */
    /* We don't pick the absolute shortest representation, but pick a balance between readability and shortness, e.g. */
    /* 1.545056189557677e-308 could be represented in a shorter form */
    /* 1545056189557677e-323 but that would be somewhat unreadable. */
    decimals = GRISU3_MIN(-d_exp, GRISU3_MAX(1, len-1));

    /* mikkelfj:
     * fix zero prefix .1 => 0.1, important for JSON export.
     * prefer unscientific notation at same length:
     * -1.2345e-4 over -1.00012345,
     * -1.0012345 over -1.2345e-3
     */
    if (d_exp < 0 && (len + d_exp) > -3 && len <= -d_exp)
    {
        /* mikkelfj: fix zero prefix .1 => 0.1, and short exponents 1.3e-2 => 0.013. */
        memmove(s2 + 2 - d_exp - len, s2, (size_t)len);
        s2[0] = '0';
        s2[1] = '.';
        for (i = 2; i < 2-d_exp-len; ++i) s2[i] = '0';
        len += i;
    }
    else if (d_exp < 0 && len > 1) /* Add decimal point? */
    {
        for(i = 0; i < decimals; ++i) s2[len-i] = s2[len-i-1];
        s2[len++ - decimals] = '.';
        d_exp += decimals;
        /* Need scientific notation as well? */
        if (d_exp != 0) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    }
    /* Add scientific notation? */
    else if (d_exp < 0 || d_exp > 2) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    /* Add zeroes instead of scientific notation? */
    else if (d_exp > 0) { while(d_exp-- > 0) s2[len++] = '0'; }
    s2[len] = '\0'; /* grisu3 doesn't null terminate, so ensure termination. */
    return (int)(s2+len-dst);
}